

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O2

void __thiscall glTF::Asset::Asset(Asset *this,IOSystem *io)

{
  _Rb_tree_header *p_Var1;
  
  this->mIOSystem = io;
  (this->mCurrentAssetDir)._M_dataplus._M_p = (pointer)&(this->mCurrentAssetDir).field_2;
  (this->mCurrentAssetDir)._M_string_length = 0;
  (this->mCurrentAssetDir).field_2._M_local_buf[0] = '\0';
  (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDicts).super__Vector_base<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mUsedIds)._M_t._M_impl.super__Rb_tree_header;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mBodyBuffer).vector = (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0;
  (this->mBodyBuffer).index = 0;
  AssetMetadata::AssetMetadata(&this->asset);
  LazyDict<glTF::Accessor>::LazyDict(&this->accessors,this,"accessors",(char *)0x0);
  LazyDict<glTF::Animation>::LazyDict(&this->animations,this,"animations",(char *)0x0);
  LazyDict<glTF::Buffer>::LazyDict(&this->buffers,this,"buffers",(char *)0x0);
  LazyDict<glTF::BufferView>::LazyDict(&this->bufferViews,this,"bufferViews",(char *)0x0);
  LazyDict<glTF::Camera>::LazyDict(&this->cameras,this,"cameras",(char *)0x0);
  LazyDict<glTF::Image>::LazyDict(&this->images,this,"images",(char *)0x0);
  LazyDict<glTF::Material>::LazyDict(&this->materials,this,"materials",(char *)0x0);
  LazyDict<glTF::Mesh>::LazyDict(&this->meshes,this,"meshes",(char *)0x0);
  LazyDict<glTF::Node>::LazyDict(&this->nodes,this,"nodes",(char *)0x0);
  LazyDict<glTF::Sampler>::LazyDict(&this->samplers,this,"samplers",(char *)0x0);
  LazyDict<glTF::Scene>::LazyDict(&this->scenes,this,"scenes",(char *)0x0);
  LazyDict<glTF::Skin>::LazyDict(&this->skins,this,"skins",(char *)0x0);
  LazyDict<glTF::Texture>::LazyDict(&this->textures,this,"textures",(char *)0x0);
  LazyDict<glTF::Light>::LazyDict(&this->lights,this,"lights","KHR_materials_common");
  (this->scene).vector = (vector<glTF::Scene_*,_std::allocator<glTF::Scene_*>_> *)0x0;
  (this->scene).index = 0;
  (this->extensionsUsed).KHR_binary_glTF = false;
  (this->extensionsUsed).KHR_materials_common = false;
  return;
}

Assistant:

Asset(IOSystem* io = 0)
            : mIOSystem(io)
            , asset()
            , accessors     (*this, "accessors")
            , animations    (*this, "animations")
            , buffers       (*this, "buffers")
            , bufferViews   (*this, "bufferViews")
            , cameras       (*this, "cameras")
            , images        (*this, "images")
            , materials     (*this, "materials")
            , meshes        (*this, "meshes")
            , nodes         (*this, "nodes")
            //, programs    (*this, "programs")
            , samplers      (*this, "samplers")
            , scenes        (*this, "scenes")
            //, shaders     (*this, "shaders")
            , skins       (*this, "skins")
            //, techniques  (*this, "techniques")
            , textures      (*this, "textures")
            , lights        (*this, "lights", "KHR_materials_common")
        {
            memset(&extensionsUsed, 0, sizeof(extensionsUsed));
        }